

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_posix.cpp
# Opt level: O1

bool QSharedMemoryPosix::runtimeSupportCheck(void)

{
  int iVar1;
  anon_class_1_0_00000001 *this;
  
  if (runtimeSupportCheck()::result == '\0') {
    this = (anon_class_1_0_00000001 *)&runtimeSupportCheck()::result;
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      runtimeSupportCheck::result = runtimeSupportCheck::anon_class_1_0_00000001::operator()(this);
      __cxa_guard_release(&runtimeSupportCheck()::result);
    }
  }
  return runtimeSupportCheck::result;
}

Assistant:

bool QSharedMemoryPosix::runtimeSupportCheck()
{
    static const bool result = []() {
        (void)shm_open("", 0, 0);         // this WILL fail
        return errno != ENOSYS;
    }();
    return result;
}